

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controlparser.cpp
# Opt level: O0

void __thiscall ControlParser::parseControlLine(ControlParser *this,string *line,Network *network)

{
  char *pcVar1;
  byte bVar2;
  bool bVar3;
  InputError *pIVar4;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [38];
  undefined1 local_72;
  allocator local_71;
  string local_70 [48];
  string local_40 [8];
  string keyword;
  Network *network_local;
  string *line_local;
  ControlParser *this_local;
  
  initializeControlSettings(this);
  std::ios::clear(&this->sin + *(long *)(*(long *)this + -0x18),0);
  std::__cxx11::istringstream::str((string *)this);
  std::__cxx11::string::string(local_40);
  std::operator>>((istream *)this,local_40);
  parseLinkSetting(this,network);
  std::operator>>((istream *)this,local_40);
  std::operator>>((istream *)this,local_40);
  bVar2 = std::ios::eof();
  pcVar1 = w_NODE;
  if ((bVar2 & 1) != 0) {
    local_72 = 1;
    pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"",&local_71);
    InputError::InputError(pIVar4,2,(string *)local_70);
    local_72 = 0;
    __cxa_throw(pIVar4,&InputError::typeinfo,InputError::~InputError);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,pcVar1,&local_99);
  bVar3 = Utilities::match((string *)local_40,(string *)local_98);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  pcVar1 = w_TIME;
  if (bVar3) {
    parseLevelSetting(this,network);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,pcVar1,&local_c1);
    bVar3 = Utilities::match((string *)local_40,(string *)local_c0);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    pcVar1 = w_CLOCKTIME;
    if (bVar3) {
      parseTimeSetting(this);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,pcVar1,&local_e9);
      bVar3 = Utilities::match((string *)local_40,(string *)local_e8);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      if (!bVar3) {
        pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_110,local_40);
        InputError::InputError(pIVar4,3,(string *)local_110);
        __cxa_throw(pIVar4,&InputError::typeinfo,InputError::~InputError);
      }
      parseTimeOfDaySetting(this);
    }
  }
  createControl(this,network);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void ControlParser::parseControlLine(string& line, Network* network)

// Formats are:
//   LINK id OPEN/CLOSED/setting IF NODE id ABOVE/BELOW value
//   . . .                       AT TIME time
//   . . .                       AT CLOCKTIME time  (AM/PM)
// where time is in decimal hours or hrs:min:sec.

{
    // ... initialize
    initializeControlSettings();

    // ... skip over LINK keyword
    sin.clear();
    sin.str(line);
    string keyword;
    sin >> keyword;

    // ... get settings for link being controlled
    parseLinkSetting(network);

    //... skip next keyword
    sin >> keyword;

    //... get next keyword
    sin >> keyword;
    if (sin.eof()) throw InputError(InputError::TOO_FEW_ITEMS, "");

    //... get node control level if keyword == NODE
    if ( Utilities::match(keyword, w_NODE) ) parseLevelSetting(network);

    //... get control time if keyword == TIME
    else if ( Utilities::match(keyword, w_TIME) ) parseTimeSetting();

    //... get control time of day if keyword == CLOCKTIME
    else if ( Utilities::match(keyword, w_CLOCKTIME) ) parseTimeOfDaySetting();

    else throw InputError(InputError::INVALID_KEYWORD, keyword);

    //... create the control
    createControl(network);
}